

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O1

void __thiscall
pbrt::AnimatedPrimitive::AnimatedPrimitive
          (AnimatedPrimitive *this,PrimitiveHandle *p,AnimatedTransform *renderFromPrimitive)

{
  long in_FS_OFFSET;
  
  (this->primitive).
  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  .bits = 0;
  (this->primitive).
  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  .bits = (p->
          super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
          ).bits;
  memcpy(&this->renderFromPrimitive,renderFromPrimitive,0x2b8);
  *(long *)(in_FS_OFFSET + -0x160) = *(long *)(in_FS_OFFSET + -0x160) + 0x2c0;
  if (renderFromPrimitive->actuallyAnimated != false) {
    return;
  }
  LogFatal<char_const(&)[33]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/primitive.cpp"
             ,0x92,"Check failed: %s",(char (*) [33])"renderFromPrimitive.IsAnimated()");
}

Assistant:

AnimatedPrimitive::AnimatedPrimitive(PrimitiveHandle p,
                                     const AnimatedTransform &renderFromPrimitive)
    : primitive(p), renderFromPrimitive(renderFromPrimitive) {
    primitiveMemory += sizeof(*this);
    CHECK(renderFromPrimitive.IsAnimated());
}